

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_2,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPUSSEImpl<double,_2,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int local_20c;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  int local_1dc;
  int local_1c8;
  int local_1c4;
  double *local_1c0;
  int local_1b4;
  int local_1b0;
  double local_f8;
  double dStack_f0;
  double local_d8;
  double dStack_d0;
  int j;
  V_Real sum2_vec;
  V_Real sum1_vec;
  int i;
  V_Real scalar;
  int w;
  int k;
  double *destPu;
  int v;
  int l;
  int stateCountMinusOne;
  double *matrices2_local;
  double *partials2_local;
  
  iVar2 = (this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount;
  for (local_1b0 = 0; local_1b0 < (this->super_BeagleCPUImpl<double,_2,_0>).kCategoryCount;
      local_1b0 = local_1b0 + 1) {
    local_1b4 = local_1b0 * (this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount *
                (this->super_BeagleCPUImpl<double,_2,_0>).kPatternCount +
                (this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount * startPattern;
    local_1c0 = destP + local_1b4;
    for (local_1c4 = startPattern; local_1c4 < endPattern; local_1c4 = local_1c4 + 1) {
      local_1c8 = local_1b0 * (this->super_BeagleCPUImpl<double,_2,_0>).kMatrixSize;
      dVar1 = scaleFactors[local_1c4];
      local_1dc = 0;
      while( true ) {
        if ((this->super_BeagleCPUImpl<double,_2,_0>).kStateCount <= local_1dc) break;
        local_1f8 = 0.0;
        dStack_1f0 = 0.0;
        local_208 = 0.0;
        dStack_200 = 0.0;
        for (local_20c = 0; local_20c < iVar2 + -1; local_20c = local_20c + 2) {
          local_1f8 = matrices1[(long)local_1c8 + (long)local_20c] *
                      partials1[(long)local_1b4 + (long)local_20c] + local_1f8;
          dStack_1f0 = (matrices1 + (long)local_1c8 + (long)local_20c)[1] *
                       (partials1 + (long)local_1b4 + (long)local_20c)[1] + dStack_1f0;
          local_208 = matrices2[(long)local_1c8 + (long)local_20c] *
                      partials2[(long)local_1b4 + (long)local_20c] + local_208;
          dStack_200 = (matrices2 + (long)local_1c8 + (long)local_20c)[1] *
                       (partials2 + (long)local_1b4 + (long)local_20c)[1] + dStack_200;
        }
        auVar4._8_8_ = dStack_1f0;
        auVar4._0_8_ = local_1f8;
        auVar3 = vpermilpd_avx(auVar4,1);
        local_d8 = auVar3._0_8_;
        dStack_d0 = auVar3._8_8_;
        auVar3._8_8_ = dStack_200;
        auVar3._0_8_ = local_208;
        auVar3 = vpermilpd_avx(auVar3,1);
        local_f8 = auVar3._0_8_;
        dStack_f0 = auVar3._8_8_;
        auVar6._8_8_ = (dStack_1f0 + dStack_d0) * (dStack_200 + dStack_f0);
        auVar6._0_8_ = (local_1f8 + local_d8) * (local_208 + local_f8);
        auVar5._8_8_ = dVar1;
        auVar5._0_8_ = dVar1;
        auVar3 = vdivpd_avx(auVar6,auVar5);
        _l = auVar3._0_8_;
        *local_1c0 = _l;
        local_1c8 = (this->super_BeagleCPUImpl<double,_2,_0>).kStateCount + 2 + local_1c8;
        local_1c0 = local_1c0 + 1;
        local_1dc = local_1dc + 1;
      }
      local_1b4 = (this->super_BeagleCPUImpl<double,_2,_0>).kPartialsPaddedStateCount + local_1b4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcPartialsPartialsFixedScaling(double* __restrict destP,
                                                                               const double* __restrict  partials1,
                                                                               const double*  __restrict  matrices1,
                                                                               const double*  __restrict  partials2,
                                                                               const double* __restrict  matrices2,
                                                                               const double* __restrict scaleFactors,
                                                                               int startPattern,
                                                                               int endPattern) {

    int stateCountMinusOne = kPartialsPaddedStateCount - 1;
#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
      int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
      double* destPu = destP + v;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            const V_Real scalar = VEC_SPLAT(scaleFactors[k]);
            for (int i = 0; i < kStateCount; i++) {

            	V_Real sum1_vec;
            	V_Real sum2_vec;

              	int j = 0;
            	sum1_vec = VEC_SETZERO();
            	sum2_vec = VEC_SETZERO();
            	for ( ; j < stateCountMinusOne; j += 2) {
            		sum1_vec = VEC_MADD(
								 VEC_LOAD(matrices1 + w + j),  // TODO This only works if w is even
								 VEC_LOAD(partials1 + v + j),  // TODO This only works if v is even
								 sum1_vec);
            		sum2_vec = VEC_MADD(
								 VEC_LOAD(matrices2 + w + j),
								 VEC_LOAD(partials2 + v + j),
								 sum2_vec);
            	}
                VEC_STORE_SCALAR(destPu,
                		VEC_DIV(VEC_MULT(
                				VEC_ADD(sum1_vec, VEC_SWAP(sum1_vec)),
                				VEC_ADD(sum2_vec, VEC_SWAP(sum2_vec))
                		), scalar));


                // increment for the extra column at the end
                w += kStateCount + T_PAD;

                destPu++;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPu++) = 0.0;
                }
            }
            v += kPartialsPaddedStateCount;
        }
    }
}